

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity.c
# Opt level: O0

char * unittest_read(char *path,size_t *size,uint32_t *fileid,void *xdata,_Bool *is_static)

{
  _Bool _Var1;
  char *path_00;
  char *buffer;
  char *newpath;
  _Bool *is_static_local;
  void *xdata_local;
  uint32_t *fileid_local;
  size_t *size_local;
  char *path_local;
  
  if (is_static != (_Bool *)0x0) {
    *is_static = false;
  }
  _Var1 = file_exists(path);
  if (_Var1) {
    path_local = file_read(path,size);
  }
  else {
    path_00 = file_buildpath(path,test_folder_path);
    if (path_00 == (char *)0x0) {
      path_local = (char *)0x0;
    }
    else {
      path_local = file_read(path_00,size);
      free(path_00);
    }
  }
  return path_local;
}

Assistant:

static const char *unittest_read (const char *path, size_t *size, uint32_t *fileid, void *xdata, bool *is_static) {
    (void) fileid, (void) xdata;
    if (is_static) *is_static = false;
    
    if (file_exists(path)) return file_read(path, size);
    
    // this unittest is able to resolve path only next to main test folder (not in nested folders)
    const char *newpath = file_buildpath(path, test_folder_path);
    if (!newpath) return NULL;
    
    const char *buffer = file_read(newpath, size);
    mem_free(newpath);
    
    return buffer;
}